

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_parser.h
# Opt level: O3

void websocket_xmask(void *msg,uint64_t len,uint32_t mask)

{
  byte bVar1;
  byte bVar3;
  byte bVar5;
  uint uVar7;
  long lVar9;
  undefined8 local_28;
  uint64_t comb;
  uint uVar2;
  uint uVar4;
  uint uVar6;
  ulong uVar8;
  
  uVar2 = mask >> 8;
  bVar1 = (byte)(mask >> 8);
  uVar4 = mask >> 0x10;
  bVar3 = (byte)(mask >> 0x10);
  uVar6 = mask >> 0x18;
  bVar5 = (byte)(mask >> 0x18);
  if (7 < len) {
    uVar7 = (uint)msg & 3;
    uVar8 = (ulong)uVar7;
    switch(uVar7) {
    case 1:
      *(byte *)((long)msg + 2) = *(byte *)((long)msg + 2) ^ bVar3;
    case 2:
      *(byte *)((long)msg + 1) = *(byte *)((long)msg + 1) ^ bVar1;
    case 3:
      lVar9 = -uVar8 + 4;
      *(byte *)msg = *msg ^ (byte)mask;
      local_28 = (ulong)mask * 0x100000001;
      mask = (uint32_t)*(byte *)((long)&local_28 + -uVar8 + 4);
      uVar2 = (uint)*(byte *)((long)&local_28 + -uVar8 + 5);
      uVar4 = (uint)*(byte *)((long)&local_28 + -uVar8 + 6);
      uVar6 = (uint)*(byte *)((long)&local_28 + (uVar8 ^ 7));
      msg = (void *)((long)msg + lVar9);
      len = len - lVar9;
    case 0:
      bVar5 = (byte)uVar6;
      bVar1 = (byte)uVar2;
      bVar3 = (byte)uVar4;
      if (((ulong)msg & 7) != 0) {
        *(uint *)msg = (uint)*msg ^
                       ((uVar2 & 0xff) << 8 | (uVar4 & 0xff) << 0x10 | uVar6 << 0x18 | mask & 0xff);
        len = len - 4;
        msg = (void *)((long)msg + 4);
      }
      if (7 < len) {
        do {
          *(ulong *)msg =
               *msg ^ (ulong)(mask & 0xff |
                             (uVar2 & 0xff) << 8 | (uVar4 & 0xff) << 0x10 | uVar6 << 0x18) *
                      0x100000001;
          len = len - 8;
          msg = (void *)((long)msg + 8);
        } while (7 < len);
      }
    }
  }
  switch(len) {
  case 0:
    return;
  case 7:
    *(byte *)((long)msg + 6) = *(byte *)((long)msg + 6) ^ bVar3;
  case 6:
    *(byte *)((long)msg + 5) = *(byte *)((long)msg + 5) ^ bVar1;
  case 5:
    *(byte *)((long)msg + 4) = *(byte *)((long)msg + 4) ^ (byte)mask;
  case 4:
    *(byte *)((long)msg + 3) = *(byte *)((long)msg + 3) ^ bVar5;
  case 3:
    *(byte *)((long)msg + 2) = *(byte *)((long)msg + 2) ^ bVar3;
  case 2:
    *(byte *)((long)msg + 1) = *(byte *)((long)msg + 1) ^ bVar1;
  case 1:
    *(byte *)msg = (byte)*msg ^ (byte)mask;
    return;
  }
}

Assistant:

void websocket_xmask(void *msg, uint64_t len, uint32_t mask) {
  if (len > 7) {
    { /* XOR any unaligned memory (4 byte alignment) */
      const uintptr_t offset = 4 - ((uintptr_t)msg & 3);
      switch (offset) {
      case 3:
        ((uint8_t *)msg)[2] ^= ((uint8_t *)(&mask))[2];
      /* fallthrough */
      case 2:
        ((uint8_t *)msg)[1] ^= ((uint8_t *)(&mask))[1];
      /* fallthrough */
      case 1:
        ((uint8_t *)msg)[0] ^= ((uint8_t *)(&mask))[0];
        /* rotate mask and move pointer to first 4 byte alignment */
        uint64_t comb = mask | ((uint64_t)mask << 32);
        ((uint8_t *)(&mask))[0] = ((uint8_t *)(&comb))[0 + offset];
        ((uint8_t *)(&mask))[1] = ((uint8_t *)(&comb))[1 + offset];
        ((uint8_t *)(&mask))[2] = ((uint8_t *)(&comb))[2 + offset];
        ((uint8_t *)(&mask))[3] = ((uint8_t *)(&comb))[3 + offset];
        msg = (void *)((uintptr_t)msg + offset);
        len -= offset;
      }
    }
#if UINTPTR_MAX <= 0xFFFFFFFF
    /* handle  4 byte XOR alignment in 32 bit mnachine*/
    while (len >= 4) {
      *((uint32_t *)msg) ^= mask;
      len -= 4;
      msg = (void *)((uintptr_t)msg + 4);
    }
#else
    /* handle first 4 byte XOR alignment and move on to 64 bits */
    if ((uintptr_t)msg & 7) {
      *((uint32_t *)msg) ^= mask;
      len -= 4;
      msg = (void *)((uintptr_t)msg + 4);
    }
    /* intrinsic / XOR by 8 byte block, memory aligned */
    const uint64_t xmask = (((uint64_t)mask) << 32) | mask;
    while (len >= 8) {
      *((uint64_t *)msg) ^= xmask;
      len -= 8;
      msg = (void *)((uintptr_t)msg + 8);
    }
#endif
  }

  /* XOR any leftover bytes (might be non aligned)  */
  switch (len) {
  case 7:
    ((uint8_t *)msg)[6] ^= ((uint8_t *)(&mask))[2];
  /* fallthrough */
  case 6:
    ((uint8_t *)msg)[5] ^= ((uint8_t *)(&mask))[1];
  /* fallthrough */
  case 5:
    ((uint8_t *)msg)[4] ^= ((uint8_t *)(&mask))[0];
  /* fallthrough */
  case 4:
    ((uint8_t *)msg)[3] ^= ((uint8_t *)(&mask))[3];
  /* fallthrough */
  case 3:
    ((uint8_t *)msg)[2] ^= ((uint8_t *)(&mask))[2];
  /* fallthrough */
  case 2:
    ((uint8_t *)msg)[1] ^= ((uint8_t *)(&mask))[1];
  /* fallthrough */
  case 1:
    ((uint8_t *)msg)[0] ^= ((uint8_t *)(&mask))[0];
    /* fallthrough */
  }
}